

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_TestEmptyFileSets::_Run(_Test_TestEmptyFileSets *this)

{
  Tester local_1b8;
  
  AddBoundaryInputs(&(this->super_AddBoundaryInputsTest).icmp_,
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    this,&(this->super_AddBoundaryInputsTest).compaction_files_);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1b8.line_ = 0xd1;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  test::Tester::Is(&local_1b8,
                   (this->super_AddBoundaryInputsTest).compaction_files_.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   (this->super_AddBoundaryInputsTest).compaction_files_.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,"compaction_files_.empty()");
  test::Tester::~Tester(&local_1b8);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1b8.line_ = 0xd2;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  test::Tester::Is(&local_1b8,
                   (this->super_AddBoundaryInputsTest).level_files_.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   (this->super_AddBoundaryInputsTest).level_files_.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,"level_files_.empty()");
  test::Tester::~Tester(&local_1b8);
  return;
}

Assistant:

TEST(AddBoundaryInputsTest, TestEmptyFileSets) {
  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_TRUE(compaction_files_.empty());
  ASSERT_TRUE(level_files_.empty());
}